

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O2

int my_fgetc(ALLEGRO_FILE *f)

{
  int iVar1;
  int iVar2;
  
  iVar1 = my_ungetc_c;
  if (my_ungetc_c == -1) {
    iVar1 = al_fgetc();
  }
  else {
    my_ungetc_c = -1;
  }
  if (((iVar1 == 0xd) || (iVar2 = iVar1, iVar1 == 10)) &&
     (iVar2 = 0, my_fgetc::LastChar != (uint)(iVar1 == 10) * 3 + 10)) {
    Lines = Lines + 1;
    iVar2 = iVar1;
  }
  my_fgetc::LastChar = iVar2;
  return iVar1;
}

Assistant:

static int my_fgetc(ALLEGRO_FILE * f)
{
   static int LastChar = '\0';
   int r;
   char TestChar;

   if (my_ungetc_c != -1) {
      r = my_ungetc_c;
      my_ungetc_c = -1;
   }
   else
      r = al_fgetc(f);

   if (r == '\n' || r == '\r') {
      TestChar = (r == '\n') ? '\r' : '\n';

      if (LastChar != TestChar) {
         Lines++;
         LastChar = r;
      } else
         LastChar = '\0';
   } else
      LastChar = r;

   return r;
}